

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

json * __thiscall argo::json::find(json *this,pointer *p)

{
  type_t tVar1;
  _List_node_base *p_Var2;
  size_t sVar3;
  string *__k;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  json_exception *pjVar6;
  exception_type et;
  _List_node_base *p_Var7;
  token t;
  
  p_Var2 = (_List_node_base *)pointer::get_path_abi_cxx11_(p);
  et = pointer_token_type_invalid_e;
  p_Var7 = p_Var2;
  while( true ) {
    p_Var7 = (((_List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_> *)
              &p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var7 == p_Var2) {
      return this;
    }
    pointer::token::token(&t,(token *)(p_Var7 + 1));
    tVar1 = pointer::token::get_type(&t);
    if (tVar1 != all_e) break;
LAB_0011735d:
    std::__cxx11::string::~string((string *)&t.m_name);
  }
  if (tVar1 == object_e) {
    if (this->m_type == object_e) {
      __k = pointer::token::get_name_abi_cxx11_(&t);
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
              ::find(&(this->m_value).u_object._M_t,__k);
      if (cVar4._M_node == (_Base_ptr)((long)&this->m_value + 8)) {
        pjVar6 = (json_exception *)__cxa_allocate_exception(0xd8);
        json_exception::json_exception(pjVar6,pointer_not_matched_e);
        __cxa_throw(pjVar6,&json_exception::typeinfo,std::exception::~exception);
      }
      p_Var5 = cVar4._M_node + 2;
LAB_0011735a:
      this = *(json **)p_Var5;
      goto LAB_0011735d;
    }
  }
  else {
    if (tVar1 != array_e) goto LAB_0011737f;
    if (this->m_type == array_e) {
      sVar3 = pointer::token::get_index(&t);
      if (sVar3 < (ulong)((long)(this->m_value).u_array.
                                super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_value).u_array.
                                super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        sVar3 = pointer::token::get_index(&t);
        p_Var5 = (_Base_ptr)
                 ((this->m_value).u_array.
                  super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + sVar3);
        goto LAB_0011735a;
      }
    }
  }
  et = pointer_not_matched_e;
LAB_0011737f:
  pjVar6 = (json_exception *)__cxa_allocate_exception(0xd8);
  json_exception::json_exception(pjVar6,et);
  __cxa_throw(pjVar6,&json_exception::typeinfo,std::exception::~exception);
}

Assistant:

const json &json::find(const pointer &p) const
{
    const json *res = this;

    for (auto t : p.get_path())
    {
        switch (t.get_type())
        {
        case pointer::token::all_e:
            break;

        case pointer::token::object_e:
            if (res->m_type == object_e)
            {
                auto i = res->m_value.u_object.find(t.get_name());
                if (i == res->m_value.u_object.end())
                {
                    throw json_exception(json_exception::pointer_not_matched_e);
                }
                else
                {
                    res = i->second.get();
                }
            }
            else
            {
                throw json_exception(json_exception::pointer_not_matched_e);
            }
            break;

        case pointer::token::array_e:
            if (res->m_type == array_e)
            {
                if (t.get_index() < res->m_value.u_array.size())
                {
                    res = (res->m_value.u_array)[t.get_index()].get();
                }
                else
                {
                    throw json_exception(json_exception::pointer_not_matched_e);
                }
            }
            else
            {
                throw json_exception(json_exception::pointer_not_matched_e);
            }
            break;

        default:
            throw json_exception(json_exception::pointer_token_type_invalid_e);
        }
    }

    return *res;
}